

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     UniversalPrinter<std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>_>::Print
               (Optional<std::basic_string_view<char>_> *value,ostream *os)

{
  std::operator<<(os,'(');
  if ((value->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == false) {
    std::operator<<(os,"nullopt");
  }
  else {
    UniversalPrinter<std::basic_string_view<char,_std::char_traits<char>_>_>::Print
              ((basic_string_view<char,_std::char_traits<char>_> *)value,os);
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }